

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateForwardDeclarations
          (FileGenerator *this,Printer *printer)

{
  int iVar1;
  FileDescriptor *file;
  undefined1 local_2c8 [8];
  FileGenerator dependency;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  ForwardDeclarations decls;
  Printer *printer_local;
  FileGenerator *this_local;
  
  decls.enums_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  ForwardDeclarations::ForwardDeclarations((ForwardDeclarations *)local_a8);
  local_ac = 0;
  while( true ) {
    iVar1 = FileDescriptor::dependency_count(this->file_);
    if (iVar1 <= local_ac) break;
    file = FileDescriptor::dependency(this->file_,local_ac);
    FileGenerator((FileGenerator *)local_2c8,file,&this->options_);
    FillForwardDeclarations((FileGenerator *)local_2c8,(ForwardDeclarations *)local_a8);
    ~FileGenerator((FileGenerator *)local_2c8);
    local_ac = local_ac + 1;
  }
  FillForwardDeclarations(this,(ForwardDeclarations *)local_a8);
  ForwardDeclarations::Print
            ((ForwardDeclarations *)local_a8,
             (Printer *)decls.enums_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &this->options_);
  ForwardDeclarations::~ForwardDeclarations((ForwardDeclarations *)local_a8);
  return;
}

Assistant:

void FileGenerator::GenerateForwardDeclarations(io::Printer* printer) {
  ForwardDeclarations decls;
  for (int i = 0; i < file_->dependency_count(); i++) {
    FileGenerator dependency(file_->dependency(i), options_);
    dependency.FillForwardDeclarations(&decls);
  }
  FillForwardDeclarations(&decls);
  decls.Print(printer, options_);
}